

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     *that,allocator_type *a)

{
  _Head_base<0UL,_unsigned_long,_false> *p_Var1;
  long lVar2;
  char cVar3;
  ctrl_t *pcVar4;
  size_t sVar5;
  slot_type *psVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [12];
  undefined1 auVar17 [13];
  undefined1 auVar18 [14];
  size_t sVar20;
  uint uVar21;
  size_t hashval;
  value_type *v;
  anon_union_8_1_a8a14541_for_iterator_1 aVar22;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar23;
  FindInfo FVar24;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_39;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *local_38;
  char *pcVar19;
  
  this->size_ = 0;
  this->capacity_ = 0;
  this->ctrl_ = (ctrl_t *)0x0;
  this->slots_ = (slot_type *)0x0;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_false>
  ._M_head_impl.id_ = a->id_;
  sVar5 = (that->settings_).
          super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
          .
          super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
          .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
          super_WithId<phmap::priv::StatefulTestingHash>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (that->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
       .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ = sVar5;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  rehash(this,that->capacity_);
  iVar23 = begin(that);
  pcVar19 = iVar23.ctrl_;
  pcVar4 = that->ctrl_;
  sVar5 = that->capacity_;
  local_38 = that;
  while (pcVar19 != pcVar4 + sVar5) {
    aVar22 = iVar23.field_1;
    sVar20 = std::
             hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator()(&local_39,(string *)((long)aVar22.slot_ + 8));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = sVar20;
    hashval = SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),0);
    FVar24 = find_first_non_full(this,hashval);
    sVar20 = FVar24.offset;
    set_ctrl(this,sVar20,(byte)hashval & 0x7f);
    psVar6 = this->slots_;
    psVar6[sVar20].value.first._vptr_NonStandardLayout =
         (_func_int **)&PTR__NonStandardLayout_00345320;
    lVar2 = (long)psVar6 + sVar20 * 0x30 + 0x18;
    *(long *)(lVar2 + -0x10) = lVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&psVar6[sVar20].value.first.value,*(long *)((long)aVar22.slot_ + 8),
               *(long *)((long)aVar22.slot_ + 0x10) + *(long *)((long)aVar22.slot_ + 8));
    (&psVar6->value)[sVar20].second = *(int *)((long)aVar22.slot_ + 0x28);
    aVar22.slot_ = aVar22.slot_ + 1;
    cVar3 = iVar23.ctrl_[1];
    pcVar19 = iVar23.ctrl_ + 1;
    while (cVar3 < -1) {
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar14 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar19 < (char)iVar11);
      in_XMM1_Bb = -(pcVar19[1] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bc = -(pcVar19[2] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bd = -(pcVar19[3] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Be = -(pcVar19[4] < (char)iVar12);
      in_XMM1_Bf = -(pcVar19[5] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bg = -(pcVar19[6] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bh = -(pcVar19[7] < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bi = -(pcVar19[8] < (char)iVar13);
      in_XMM1_Bj = -(pcVar19[9] < (char)((uint)iVar13 >> 8));
      in_XMM1_Bk = -(pcVar19[10] < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bl = -(pcVar19[0xb] < (char)((uint)iVar13 >> 0x18));
      in_XMM1_Bm = -(pcVar19[0xc] < (char)iVar14);
      in_XMM1_Bn = -(pcVar19[0xd] < (char)((uint)iVar14 >> 8));
      in_XMM1_Bo = -(pcVar19[0xe] < (char)((uint)iVar14 >> 0x10));
      in_XMM1_Bp = -(pcVar19[0xf] < (char)((uint)iVar14 >> 0x18));
      auVar9[1] = in_XMM1_Bb;
      auVar9[0] = in_XMM1_Ba;
      auVar9[2] = in_XMM1_Bc;
      auVar9[3] = in_XMM1_Bd;
      auVar9[4] = in_XMM1_Be;
      auVar9[5] = in_XMM1_Bf;
      auVar9[6] = in_XMM1_Bg;
      auVar9[7] = in_XMM1_Bh;
      auVar9[8] = in_XMM1_Bi;
      auVar9[9] = in_XMM1_Bj;
      auVar9[10] = in_XMM1_Bk;
      auVar9[0xb] = in_XMM1_Bl;
      auVar9[0xc] = in_XMM1_Bm;
      auVar9[0xd] = in_XMM1_Bn;
      auVar9[0xe] = in_XMM1_Bo;
      auVar9[0xf] = in_XMM1_Bp;
      auVar10[1] = in_XMM1_Bb;
      auVar10[0] = in_XMM1_Ba;
      auVar10[2] = in_XMM1_Bc;
      auVar10[3] = in_XMM1_Bd;
      auVar10[4] = in_XMM1_Be;
      auVar10[5] = in_XMM1_Bf;
      auVar10[6] = in_XMM1_Bg;
      auVar10[7] = in_XMM1_Bh;
      auVar10[8] = in_XMM1_Bi;
      auVar10[9] = in_XMM1_Bj;
      auVar10[10] = in_XMM1_Bk;
      auVar10[0xb] = in_XMM1_Bl;
      auVar10[0xc] = in_XMM1_Bm;
      auVar10[0xd] = in_XMM1_Bn;
      auVar10[0xe] = in_XMM1_Bo;
      auVar10[0xf] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bd;
      auVar18[0] = in_XMM1_Bc;
      auVar18[2] = in_XMM1_Be;
      auVar18[3] = in_XMM1_Bf;
      auVar18[4] = in_XMM1_Bg;
      auVar18[5] = in_XMM1_Bh;
      auVar18[6] = in_XMM1_Bi;
      auVar18[7] = in_XMM1_Bj;
      auVar18[8] = in_XMM1_Bk;
      auVar18[9] = in_XMM1_Bl;
      auVar18[10] = in_XMM1_Bm;
      auVar18[0xb] = in_XMM1_Bn;
      auVar18[0xc] = in_XMM1_Bo;
      auVar18[0xd] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Be;
      auVar17[0] = in_XMM1_Bd;
      auVar17[2] = in_XMM1_Bf;
      auVar17[3] = in_XMM1_Bg;
      auVar17[4] = in_XMM1_Bh;
      auVar17[5] = in_XMM1_Bi;
      auVar17[6] = in_XMM1_Bj;
      auVar17[7] = in_XMM1_Bk;
      auVar17[8] = in_XMM1_Bl;
      auVar17[9] = in_XMM1_Bm;
      auVar17[10] = in_XMM1_Bn;
      auVar17[0xb] = in_XMM1_Bo;
      auVar17[0xc] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bf;
      auVar16[0] = in_XMM1_Be;
      auVar16[2] = in_XMM1_Bg;
      auVar16[3] = in_XMM1_Bh;
      auVar16[4] = in_XMM1_Bi;
      auVar16[5] = in_XMM1_Bj;
      auVar16[6] = in_XMM1_Bk;
      auVar16[7] = in_XMM1_Bl;
      auVar16[8] = in_XMM1_Bm;
      auVar16[9] = in_XMM1_Bn;
      auVar16[10] = in_XMM1_Bo;
      auVar16[0xb] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bg;
      auVar15[0] = in_XMM1_Bf;
      auVar15[2] = in_XMM1_Bh;
      auVar15[3] = in_XMM1_Bi;
      auVar15[4] = in_XMM1_Bj;
      auVar15[5] = in_XMM1_Bk;
      auVar15[6] = in_XMM1_Bl;
      auVar15[7] = in_XMM1_Bm;
      auVar15[8] = in_XMM1_Bn;
      auVar15[9] = in_XMM1_Bo;
      auVar15[10] = in_XMM1_Bp;
      uVar21 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar7 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      aVar22.slot_ = (slot_type *)((long)aVar22.slot_ + (ulong)(uVar7 * 0x30));
      cVar3 = pcVar19[uVar7];
      pcVar19 = pcVar19 + uVar7;
    }
    iVar23.field_1.slot_ = aVar22.slot_;
    iVar23.ctrl_ = pcVar19;
  }
  sVar5 = local_38->size_;
  this->size_ = sVar5;
  p_Var1 = &(this->settings_).
            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
            .super__Head_base<0UL,_unsigned_long,_false>;
  p_Var1->_M_head_impl = p_Var1->_M_head_impl - sVar5;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
        : raw_hash_set(0, that.hash_ref(), that.eq_ref(), a) {
        rehash(that.capacity());   // operator=() should preserve load_factor
        // Because the table is guaranteed to be empty, we can do something faster
        // than a full `insert`.
        for (const auto& v : that) {
            const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
            auto target = find_first_non_full(hashval);
            set_ctrl(target.offset, H2(hashval));
            emplace_at(target.offset, v);
            infoz_.RecordInsert(hashval, target.probe_length);
        }
        size_ = that.size();
        growth_left() -= that.size();
    }